

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Document::parseTAGDirective(Document *this)

{
  char *pcVar1;
  mapped_type *pmVar2;
  StringRef SVar3;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Chars_01;
  undefined1 local_90 [8];
  Token Tag;
  undefined1 local_48 [8];
  StringRef TagHandle;
  char *pcStack_30;
  
  getNext((Token *)local_90,this);
  TagHandle.Length = Tag._0_8_;
  SVar3.Length = 2;
  SVar3.Data = " \t";
  pcVar1 = (char *)StringRef::find_first_of((StringRef *)&TagHandle.Length,SVar3,0);
  if (Tag.Range.Data < pcVar1) {
    pcVar1 = Tag.Range.Data;
  }
  TagHandle.Data = Tag.Range.Data + -(long)pcVar1;
  local_48 = (undefined1  [8])(pcVar1 + TagHandle.Length);
  Chars.Length = 2;
  Chars.Data = " \t";
  join_0x00000010_0x00000000_ = StringRef::ltrim((StringRef *)local_48,Chars);
  Chars_00.Length = 2;
  Chars_00.Data = " \t";
  TagHandle.Data = (char *)StringRef::find_first_of((StringRef *)&TagHandle.Length,Chars_00,0);
  if (pcStack_30 < TagHandle.Data) {
    TagHandle.Data = pcStack_30;
  }
  local_48 = (undefined1  [8])TagHandle.Length;
  Tag.Value.field_2._8_8_ = TagHandle.Data + TagHandle.Length;
  Chars_01.Length = 2;
  Chars_01.Data = " \t";
  SVar3 = StringRef::ltrim((StringRef *)((long)&Tag.Value.field_2 + 8),Chars_01);
  pmVar2 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,(key_type *)local_48);
  pmVar2->Data = SVar3.Data;
  pmVar2->Length = SVar3.Length;
  std::__cxx11::string::~string((string *)&Tag.Range.Length);
  return;
}

Assistant:

void Document::parseTAGDirective() {
  Token Tag = getNext(); // %TAG <handle> <prefix>
  StringRef T = Tag.Range;
  // Strip %TAG
  T = T.substr(T.find_first_of(" \t")).ltrim(" \t");
  std::size_t HandleEnd = T.find_first_of(" \t");
  StringRef TagHandle = T.substr(0, HandleEnd);
  StringRef TagPrefix = T.substr(HandleEnd).ltrim(" \t");
  TagMap[TagHandle] = TagPrefix;
}